

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode Curl_http2_add_child(Curl_easy *parent,Curl_easy *child,_Bool exclusive)

{
  Curl_easy *pCVar1;
  Curl_http2_dep *pCVar2;
  Curl_http2_dep *local_40;
  Curl_http2_dep *node;
  Curl_http2_dep *dep;
  Curl_http2_dep **tail;
  _Bool exclusive_local;
  Curl_easy *child_local;
  Curl_easy *parent_local;
  
  if (parent != (Curl_easy *)0x0) {
    pCVar2 = (Curl_http2_dep *)(*Curl_ccalloc)(1,0x10);
    if (pCVar2 == (Curl_http2_dep *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pCVar2->data = child;
    if (((parent->set).stream_dependents != (Curl_http2_dep *)0x0) && (exclusive)) {
      for (local_40 = (parent->set).stream_dependents; local_40 != (Curl_http2_dep *)0x0;
          local_40 = local_40->next) {
        (local_40->data->set).stream_depends_on = child;
      }
      for (dep = (Curl_http2_dep *)&(child->set).stream_dependents;
          dep->next != (Curl_http2_dep *)0x0; dep = dep->next) {
      }
      dep->next = (parent->set).stream_dependents;
      (parent->set).stream_dependents = (Curl_http2_dep *)0x0;
    }
    for (dep = (Curl_http2_dep *)&(parent->set).stream_dependents;
        dep->next != (Curl_http2_dep *)0x0; dep = dep->next) {
      pCVar1 = dep->next->data;
      *(ulong *)&(pCVar1->set).field_0x8e2 =
           *(ulong *)&(pCVar1->set).field_0x8e2 & 0xffffdfffffffffff;
    }
    dep->next = pCVar2;
  }
  (child->set).stream_depends_on = parent;
  *(ulong *)&(child->set).field_0x8e2 =
       *(ulong *)&(child->set).field_0x8e2 & 0xffffdfffffffffff | (ulong)exclusive << 0x2d;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http2_add_child(struct Curl_easy *parent,
                              struct Curl_easy *child,
                              bool exclusive)
{
  if(parent) {
    struct Curl_http2_dep **tail;
    struct Curl_http2_dep *dep = calloc(1, sizeof(struct Curl_http2_dep));
    if(!dep)
      return CURLE_OUT_OF_MEMORY;
    dep->data = child;

    if(parent->set.stream_dependents && exclusive) {
      struct Curl_http2_dep *node = parent->set.stream_dependents;
      while(node) {
        node->data->set.stream_depends_on = child;
        node = node->next;
      }

      tail = &child->set.stream_dependents;
      while(*tail)
        tail = &(*tail)->next;

      DEBUGASSERT(!*tail);
      *tail = parent->set.stream_dependents;
      parent->set.stream_dependents = 0;
    }

    tail = &parent->set.stream_dependents;
    while(*tail) {
      (*tail)->data->set.stream_depends_e = FALSE;
      tail = &(*tail)->next;
    }

    DEBUGASSERT(!*tail);
    *tail = dep;
  }

  child->set.stream_depends_on = parent;
  child->set.stream_depends_e = exclusive;
  return CURLE_OK;
}